

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# untyped_message.cc
# Opt level: O1

Status __thiscall
google::protobuf::json_internal::MakeEndGroupMismatchError
          (json_internal *this,int field_number,int current_group)

{
  long *local_50;
  undefined8 local_48;
  long local_40 [2];
  ulong local_30;
  code *local_28;
  ulong local_20;
  code *local_18;
  
  local_30 = (ulong)(uint)field_number;
  local_28 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
  local_20 = (ulong)(uint)current_group;
  local_18 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
  absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
            (&local_50,"attempted to close group %d while inside group %d",0x31,&local_30,2);
  absl::lts_20240722::InvalidArgumentError(this,local_48,local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

PROTOBUF_NOINLINE static absl::Status MakeEndGroupMismatchError(
    int field_number, int current_group) {
  return absl::InvalidArgumentError(
      absl::StrFormat("attempted to close group %d while inside group %d",
                      field_number, current_group));
}